

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopBalance.c
# Opt level: O0

int Hop_NodeCompareLevelsDecrease(Hop_Obj_t **pp1,Hop_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  int Diff;
  Hop_Obj_t **pp2_local;
  Hop_Obj_t **pp1_local;
  
  pHVar3 = Hop_Regular(*pp1);
  iVar1 = Hop_ObjLevel(pHVar3);
  pHVar3 = Hop_Regular(*pp2);
  iVar2 = Hop_ObjLevel(pHVar3);
  if (iVar1 - iVar2 < 1) {
    if (iVar1 - iVar2 < 0) {
      pp1_local._4_4_ = 1;
    }
    else {
      pHVar3 = Hop_Regular(*pp1);
      iVar1 = pHVar3->Id;
      pHVar3 = Hop_Regular(*pp2);
      iVar1 = iVar1 - pHVar3->Id;
      if (iVar1 < 1) {
        if (iVar1 < 0) {
          pp1_local._4_4_ = 1;
        }
        else {
          pp1_local._4_4_ = 0;
        }
      }
      else {
        pp1_local._4_4_ = -1;
      }
    }
  }
  else {
    pp1_local._4_4_ = -1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Hop_NodeCompareLevelsDecrease( Hop_Obj_t ** pp1, Hop_Obj_t ** pp2 )
{
    int Diff = Hop_ObjLevel(Hop_Regular(*pp1)) - Hop_ObjLevel(Hop_Regular(*pp2));
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    Diff = Hop_Regular(*pp1)->Id - Hop_Regular(*pp2)->Id;
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    return 0; 
}